

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

qcc_stream_data
qcc_stream_data_process
          (qcc_stream_data data,qcc_arena *arena,qcc_stream_node *begin,qcc_stream_node *end,
          qcc_stream_data_process_fn proc)

{
  bool bVar1;
  uint uVar2;
  qcc_list_node *node;
  qcc_stream_node *pqVar3;
  qcc_stream_node *pqVar4;
  bool bVar5;
  qcc_stream_data qVar6;
  qcc_uint value;
  qcc_stream_data result;
  qcc_list_node local_60;
  qcc_stream_node *local_58;
  qcc_stream_node *local_50;
  qcc_stream_data_process_fn local_48;
  qcc_list local_40;
  
  pqVar3 = data.last;
  pqVar4 = data.first;
  local_48 = proc;
  qcc_list_init(&local_40);
  if (pqVar4 == (qcc_stream_node *)0x0) {
    local_58 = (qcc_stream_node *)0x0;
  }
  else {
    bVar5 = false;
    bVar1 = false;
    local_58 = pqVar4;
    local_50 = pqVar3;
    do {
      if (pqVar4 == begin) {
        bVar1 = true;
      }
      if (pqVar4 == end) {
        bVar1 = false;
      }
      local_60.next = (qcc_list_node *)pqVar4->value;
      if (bVar1) {
        uVar2 = (*local_48)((qcc_uint *)&local_60);
        bVar5 = true;
        if (uVar2 == 0) {
          bVar5 = local_60.next != (qcc_list_node *)pqVar4->value;
          goto LAB_00102d8d;
        }
      }
      else {
LAB_00102d8d:
        node = (qcc_list_node *)qcc_arena_alloc(arena,0x10);
        node[1].next = local_60.next;
        qcc_list_push_back(&local_40,node);
      }
      pqVar4 = pqVar4->next;
    } while (pqVar4 != (qcc_stream_node *)0x0);
    pqVar3 = local_50;
    if (bVar5) {
      local_58 = (qcc_stream_node *)local_40.first;
      pqVar3 = (qcc_stream_node *)local_40.last;
    }
  }
  qVar6.last = pqVar3;
  qVar6.first = local_58;
  return qVar6;
}

Assistant:

struct qcc_stream_data
qcc_stream_data_process(struct qcc_stream_data data, struct qcc_arena *arena,
                        const struct qcc_stream_node *begin,
                        const struct qcc_stream_node *end,
                        qcc_stream_data_process_fn proc)
{
    struct qcc_stream_data result;
    qcc_stream_data_init(&result);

    unsigned in_range = 0;
    unsigned is_changed = 0;
    for (struct qcc_stream_node *node = data.first; node; node = node->next)
    {
        if (node == begin) in_range = 1;
        if (node == end) in_range = 0;

        qcc_uint value = node->value;
        if (in_range)
        {
            unsigned skip = proc(&value);
            is_changed = skip || (value != node->value);
            if (skip) continue;
        }

        QCC_ARENA_POD(arena, qcc_stream_node, copy);
        copy->value = value;
        qcc_stream_data_push_back(&result, copy);
    }

    return is_changed ? result : data;
}